

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O0

Type wasm::TypeUpdating::getValidLocalType(Type type,FeatureSet features)

{
  bool bVar1;
  HeapType heapType;
  Type local_30;
  uintptr_t local_28;
  FeatureSet local_1c;
  Type TStack_18;
  FeatureSet features_local;
  Type type_local;
  
  local_28 = type.id;
  local_1c.features = features.features;
  TStack_18.id = type.id;
  bVar1 = canHandleAsLocal(type);
  if (bVar1) {
    bVar1 = wasm::Type::isNonNullable(&stack0xffffffffffffffe8);
    if ((bVar1) && (bVar1 = FeatureSet::hasGCNNLocals(&local_1c), !bVar1)) {
      heapType = wasm::Type::getHeapType(&stack0xffffffffffffffe8);
      wasm::Type::Type(&local_30,heapType,Nullable);
      TStack_18.id = local_30.id;
    }
    return (Type)TStack_18.id;
  }
  __assert_fail("canHandleAsLocal(type)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                ,0x182,"Type wasm::TypeUpdating::getValidLocalType(Type, FeatureSet)");
}

Assistant:

Type getValidLocalType(Type type, FeatureSet features) {
  // TODO: this should handle tuples with a non-nullable item
  assert(canHandleAsLocal(type));
  if (type.isNonNullable() && !features.hasGCNNLocals()) {
    type = Type(type.getHeapType(), Nullable);
  }
  return type;
}